

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O3

FaceIter __thiscall CMU462::HalfedgeMesh::eraseVertex(HalfedgeMesh *this,VertexIter v)

{
  size_t *psVar1;
  undefined8 uVar2;
  _List_iterator<CMU462::Face> *p_Var3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  _List_node_base *p_Var7;
  _List_iterator<CMU462::Halfedge> *hj_1;
  _List_node_base *p_Var8;
  long lVar9;
  _List_iterator<CMU462::Halfedge> *p_Var10;
  long lVar11;
  _List_iterator<CMU462::Halfedge> *hj_2;
  _List_iterator<CMU462::Halfedge> _Var12;
  _List_iterator<CMU462::Edge> *p_Var13;
  _List_iterator<CMU462::Face> *fj;
  HalfedgeIter hi;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_to_be_deleted;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_all;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_first;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_last;
  HalfedgeIter ht;
  HalfedgeIter h;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  f_to_be_deleted;
  HalfedgeIter hj;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  e_to_be_deleted;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  v_outer_vec;
  _List_iterator<CMU462::Halfedge> local_130;
  _List_iterator<CMU462::Halfedge> *local_128;
  iterator iStack_120;
  _List_iterator<CMU462::Halfedge> *local_118;
  _List_iterator<CMU462::Halfedge> *local_108;
  iterator iStack_100;
  _List_iterator<CMU462::Halfedge> *local_f8;
  undefined8 *local_e8;
  iterator iStack_e0;
  _List_iterator<CMU462::Halfedge> *local_d8;
  void *local_c8;
  iterator iStack_c0;
  _List_iterator<CMU462::Halfedge> *local_b8;
  _List_iterator<CMU462::Halfedge> local_a8;
  _List_iterator<CMU462::Halfedge> local_a0;
  _List_iterator<CMU462::Face> *local_98;
  iterator iStack_90;
  _List_iterator<CMU462::Face> *local_88;
  _List_iterator<CMU462::Halfedge> local_80;
  _List_iterator<CMU462::Edge> *local_78;
  iterator iStack_70;
  _List_iterator<CMU462::Edge> *local_68;
  void *local_58;
  iterator iStack_50;
  _List_iterator<CMU462::Vertex> *local_48;
  _List_node_base *local_40;
  _List_node_base *local_38;
  
  local_a0._M_node = v._M_node[0xc]._M_prev;
  local_a8._M_node = local_a0._M_node[1]._M_next;
  local_118 = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_128 = (_List_iterator<CMU462::Halfedge> *)0x0;
  iStack_120._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_d8 = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_e8 = (undefined8 *)0x0;
  iStack_e0._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_b8 = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_c8 = (void *)0x0;
  iStack_c0._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_f8 = (_List_iterator<CMU462::Halfedge> *)0x0;
  local_108 = (_List_iterator<CMU462::Halfedge> *)0x0;
  iStack_100._M_current = (_List_iterator<CMU462::Halfedge> *)0x0;
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
  ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
            ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
              *)&local_128,(iterator)0x0,&local_a0);
  if (iStack_120._M_current == local_118) {
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
    ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
              ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                *)&local_128,iStack_120,&local_a8);
  }
  else {
    (iStack_120._M_current)->_M_node = local_a8._M_node;
    iStack_120._M_current = iStack_120._M_current + 1;
  }
  if (iStack_e0._M_current == local_d8) {
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
    ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
              ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                *)&local_e8,iStack_e0,
               (_List_iterator<CMU462::Halfedge> *)&local_a0._M_node[1]._M_prev);
  }
  else {
    (iStack_e0._M_current)->_M_node = local_a0._M_node[1]._M_prev;
    iStack_e0._M_current = iStack_e0._M_current + 1;
  }
  local_58 = (void *)0x0;
  iStack_50._M_current = (_List_iterator<CMU462::Vertex> *)0x0;
  local_48 = (_List_iterator<CMU462::Vertex> *)0x0;
  std::
  vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>::
  _M_realloc_insert<std::_List_iterator<CMU462::Vertex>const&>
            ((vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
              *)&local_58,(iterator)0x0,(_List_iterator<CMU462::Vertex> *)(local_a8._M_node + 2));
  local_78 = (_List_iterator<CMU462::Edge> *)0x0;
  iStack_70._M_current = (_List_iterator<CMU462::Edge> *)0x0;
  local_68 = (_List_iterator<CMU462::Edge> *)0x0;
  std::vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>::
  _M_realloc_insert<std::_List_iterator<CMU462::Edge>const&>
            ((vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
              *)&local_78,(iterator)0x0,(_List_iterator<CMU462::Edge> *)&local_a0._M_node[2]._M_prev
            );
  local_38 = local_a0._M_node[3]._M_next;
  local_98 = (_List_iterator<CMU462::Face> *)0x0;
  iStack_90._M_current = (_List_iterator<CMU462::Face> *)0x0;
  local_88 = (_List_iterator<CMU462::Face> *)0x0;
  local_130._M_node = local_a8._M_node[1]._M_prev;
  _Var12._M_node = local_a8._M_node;
  local_40 = v._M_node;
  if (local_a0._M_node != local_130._M_node) {
    do {
      if (iStack_120._M_current == local_118) {
        std::
        vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                  ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                    *)&local_128,iStack_120,&local_130);
      }
      else {
        (iStack_120._M_current)->_M_node = local_130._M_node;
        iStack_120._M_current = iStack_120._M_current + 1;
      }
      if (iStack_120._M_current == local_118) {
        std::
        vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                  ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                    *)&local_128,iStack_120,
                   (_List_iterator<CMU462::Halfedge> *)(local_130._M_node + 1));
      }
      else {
        (iStack_120._M_current)->_M_node = local_130._M_node[1]._M_next;
        iStack_120._M_current = iStack_120._M_current + 1;
      }
      if (iStack_e0._M_current == local_d8) {
        std::
        vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                  ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                    *)&local_e8,iStack_e0,
                   (_List_iterator<CMU462::Halfedge> *)&local_130._M_node[1]._M_prev);
      }
      else {
        (iStack_e0._M_current)->_M_node = local_130._M_node[1]._M_prev;
        iStack_e0._M_current = iStack_e0._M_current + 1;
      }
      if (iStack_50._M_current == local_48) {
        std::
        vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Vertex>const&>
                  ((vector<std::_List_iterator<CMU462::Vertex>,std::allocator<std::_List_iterator<CMU462::Vertex>>>
                    *)&local_58,iStack_50,
                   (_List_iterator<CMU462::Vertex> *)(local_130._M_node[1]._M_next + 2));
      }
      else {
        (iStack_50._M_current)->_M_node = local_130._M_node[1]._M_next[2]._M_next;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      if (iStack_70._M_current == local_68) {
        std::
        vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Edge>const&>
                  ((vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
                    *)&local_78,iStack_70,
                   (_List_iterator<CMU462::Edge> *)&local_130._M_node[2]._M_prev);
      }
      else {
        (iStack_70._M_current)->_M_node = local_130._M_node[2]._M_prev;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
      if (iStack_90._M_current == local_88) {
        std::
        vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Face>const&>
                  ((vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
                    *)&local_98,iStack_90,(_List_iterator<CMU462::Face> *)(local_130._M_node + 3));
      }
      else {
        (iStack_90._M_current)->_M_node = local_130._M_node[3]._M_next;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      local_80._M_node = local_130._M_node;
      while (p_Var8 = local_80._M_node[1]._M_prev, p_Var8 != _Var12._M_node) {
        local_80._M_node = p_Var8;
        if (iStack_100._M_current == local_f8) {
          std::
          vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
          ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                    ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                      *)&local_108,iStack_100,&local_80);
        }
        else {
          (iStack_100._M_current)->_M_node = p_Var8;
          iStack_100._M_current = iStack_100._M_current + 1;
        }
      }
      if (iStack_c0._M_current == local_b8) {
        std::
        vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                  ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                    *)&local_c8,iStack_c0,&local_80);
      }
      else {
        (iStack_c0._M_current)->_M_node = local_80._M_node;
        iStack_c0._M_current = iStack_c0._M_current + 1;
      }
      _Var12._M_node = local_130._M_node[1]._M_next;
      local_130._M_node = _Var12._M_node[1]._M_prev;
    } while (local_a0._M_node != local_130._M_node);
  }
  p_Var7 = local_38;
  p_Var8 = local_130._M_node[1]._M_prev;
  if (p_Var8 != _Var12._M_node) {
    do {
      local_130._M_node = p_Var8;
      if (iStack_100._M_current == local_f8) {
        std::
        vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
        ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
                  ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                    *)&local_108,iStack_100,&local_130);
      }
      else {
        (iStack_100._M_current)->_M_node = p_Var8;
        iStack_100._M_current = iStack_100._M_current + 1;
      }
      p_Var8 = local_130._M_node[1]._M_prev;
    } while (p_Var8 != _Var12._M_node);
  }
  if (iStack_c0._M_current == local_b8) {
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
    ::_M_realloc_insert<std::_List_iterator<CMU462::Halfedge>const&>
              ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                *)&local_c8,iStack_c0,&local_130);
  }
  else {
    (iStack_c0._M_current)->_M_node = local_130._M_node;
    iStack_c0._M_current = iStack_c0._M_current + 1;
  }
  iVar4._M_current = (_List_iterator<CMU462::Halfedge> *)iStack_120;
  p_Var10 = local_108;
  if ((long)iStack_e0._M_current - (long)local_e8 != 0) {
    lVar9 = (long)iStack_e0._M_current - (long)local_e8 >> 3;
    lVar11 = 0;
    do {
      uVar2 = local_e8[lVar11];
      *(undefined8 *)(*(long *)((long)local_c8 + lVar11 * 8) + 0x18) = uVar2;
      *(undefined8 *)(*(long *)((long)local_58 + lVar11 * 8) + 200) = uVar2;
      lVar11 = lVar11 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar11);
  }
  for (; p_Var10 != iStack_100._M_current; p_Var10 = p_Var10 + 1) {
    p_Var10->_M_node[3]._M_next = p_Var7;
  }
  p_Var7[9]._M_next = (_List_node_base *)*local_e8;
  for (p_Var10 = local_128; p_Var8 = local_40, p_Var10 != iVar4._M_current; p_Var10 = p_Var10 + 1) {
    p_Var8 = p_Var10->_M_node;
    psVar1 = &(this->halfedges).
              super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl._M_node.
              _M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var8,0x38);
  }
  psVar1 = &(this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(p_Var8,0xd0);
  iVar6._M_current = (_List_iterator<CMU462::Edge> *)iStack_70;
  for (p_Var13 = local_78; iVar5._M_current = (_List_iterator<CMU462::Face> *)iStack_90,
      p_Var3 = local_98, p_Var13 != iVar6._M_current; p_Var13 = p_Var13 + 1) {
    p_Var8 = p_Var13->_M_node;
    psVar1 = &(this->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var8,0x60);
  }
  for (; p_Var3 != iVar5._M_current; p_Var3 = p_Var3 + 1) {
    p_Var8 = p_Var3->_M_node;
    psVar1 = &(this->faces).super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var8,0xa0);
  }
  if (local_98 != (_List_iterator<CMU462::Face> *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  if (local_78 != (_List_iterator<CMU462::Edge> *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  if (local_108 != (_List_iterator<CMU462::Halfedge> *)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_e8 != (undefined8 *)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  if (local_128 != (_List_iterator<CMU462::Halfedge> *)0x0) {
    operator_delete(local_128,(long)local_118 - (long)local_128);
  }
  return (FaceIter)p_Var7;
}

Assistant:

FaceIter HalfedgeMesh::eraseVertex(VertexIter v) {
  // This method should replace the given vertex and all its neighboring
  // edges and faces with a single face, returning the new face.

  // Collect
  // HalfEdges
  auto h = v->halfedge(), ht = h->twin();
  vector<HalfedgeIter> h_to_be_deleted, h_outer_first, h_outer_last, h_outer_all;
  h_to_be_deleted.push_back(h);
  h_to_be_deleted.push_back(ht);
  h_outer_first.push_back(h->next());

  // Vertices
  vector<VertexIter> v_outer_vec;
  v_outer_vec.push_back(ht->vertex());

  // Edges
  vector<EdgeIter> e_to_be_deleted;
  e_to_be_deleted.push_back(h->edge());

  // Faces
  auto f0 = h->face();
  vector<FaceIter> f_to_be_deleted;

  // Iterations through remaining
  auto hp = ht, hi = hp->next();
  while (hi != h) {
    h_to_be_deleted.push_back(hi);
    h_to_be_deleted.push_back(hi->twin());
    h_outer_first.push_back(hi->next());

    v_outer_vec.push_back(hi->twin()->vertex());
    e_to_be_deleted.push_back(hi->edge());
    f_to_be_deleted.push_back(hi->face());

    auto hj = hi;
    while (hj->next() != hp) {
      hj = hj->next();
      h_outer_all.push_back(hj);
    }
    h_outer_last.push_back(hj);

    hp = hi->twin();
    hi = hp->next();
  }
  while (hi->next() != hp) {
    hi = hi->next();
    h_outer_all.push_back(hi);
  }
  h_outer_last.push_back(hi);

  // Reassign
  Size n = h_outer_first.size();
  for (Index i = 0; i < n; ++i) {
    h_outer_last[i]->next() = h_outer_first[i];
    v_outer_vec[i]->halfedge() = h_outer_first[i];
  }
  for (auto& hj : h_outer_all) {
    hj->face() = f0;
  }
  f0->halfedge() = h_outer_first.front();

  // Delete
  for (auto& hj : h_to_be_deleted) {
    deleteHalfedge(hj);
  }
  deleteVertex(v);
  for (auto& ej : e_to_be_deleted) {
    deleteEdge(ej);
  }
  for (auto& fj : f_to_be_deleted) {
    deleteFace(fj);
  }

  return f0;
}